

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

void __thiscall
PossibleContentsTest_TestIntersection_Test::TestBody
          (PossibleContentsTest_TestIntersection_Test *this)

{
  PossibleContents *pPVar1;
  PossibleContents *pPVar2;
  PossibleContents *pPVar3;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_580;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_560;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_540;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_520;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_500;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_4e0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_4c0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_4a0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_480;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_460;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_440;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_420;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_400;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3e0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3c0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3a0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_380;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_360;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_340;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_320;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_300;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2e0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2c0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2a0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_280;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_260;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_240;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_220;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_200;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1e0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1c0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1a0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_180;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_160;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_140;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_120;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_100;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_e0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_c0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_a0;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_80;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_60;
  PossibleContents *local_40;
  PossibleContents *local_38;
  
  pPVar1 = &(this->super_PossibleContentsTest).none;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_580,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_2e0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertLackIntersection((PossibleContents *)&local_580,(PossibleContents *)&local_2e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_2e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_580);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_560,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  pPVar2 = &(this->super_PossibleContentsTest).i32Zero;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_2c0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertLackIntersection((PossibleContents *)&local_560,(PossibleContents *)&local_2c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_2c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_560);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_540,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  pPVar1 = &(this->super_PossibleContentsTest).many;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_2a0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertLackIntersection((PossibleContents *)&local_540,(PossibleContents *)&local_2a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_2a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_540);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_520,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_280,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertHaveIntersection((PossibleContents *)&local_520,(PossibleContents *)&local_280);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_280);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_520);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_500,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_260,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_500,(PossibleContents *)&local_260);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_260);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_500);
  pPVar1 = &(this->super_PossibleContentsTest).exactI32;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_4e0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  pPVar3 = &(this->super_PossibleContentsTest).exactAnyref;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_240,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  assertLackIntersection((PossibleContents *)&local_4e0,(PossibleContents *)&local_240);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_240);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_4e0);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_4c0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_220,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  local_40 = pPVar3;
  local_38 = pPVar2;
  assertLackIntersection((PossibleContents *)&local_4c0,(PossibleContents *)&local_220);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_220);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_4c0);
  pPVar2 = &(this->super_PossibleContentsTest).exactFuncSignatureType;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_4a0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  pPVar3 = &(this->super_PossibleContentsTest).funcNull;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_200,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  assertHaveIntersection((PossibleContents *)&local_4a0,(PossibleContents *)&local_200);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_200);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_4a0);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_480,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_1e0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)local_40);
  assertLackIntersection((PossibleContents *)&local_480,(PossibleContents *)&local_1e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_1e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_480);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_460,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).anyNull);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_1c0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  assertLackIntersection((PossibleContents *)&local_460,(PossibleContents *)&local_1c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_1c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_460);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_440,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_1a0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertHaveIntersection((PossibleContents *)&local_440,(PossibleContents *)&local_1a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_1a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_440);
  pPVar1 = local_38;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_420,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)local_38);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_180,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertHaveIntersection((PossibleContents *)&local_420,(PossibleContents *)&local_180);
  pPVar1 = local_40;
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_180);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_420);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_400,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_160,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_400,(PossibleContents *)&local_160);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_160);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_400);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_3e0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)local_38);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_140,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).i32One);
  assertHaveIntersection((PossibleContents *)&local_3e0,(PossibleContents *)&local_140);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_140);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_3e0);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_3c0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_120,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactNonNullAnyref);
  assertHaveIntersection((PossibleContents *)&local_3c0,(PossibleContents *)&local_120);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_120);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_3c0);
  pPVar1 = &(this->super_PossibleContentsTest).funcGlobal;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_3a0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_100,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  assertHaveIntersection((PossibleContents *)&local_3a0,(PossibleContents *)&local_100);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_100);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_3a0);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_380,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_e0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_380,(PossibleContents *)&local_e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_e0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_380);
  pPVar3 = &(this->super_PossibleContentsTest).nonNullFuncGlobal;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_360,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_c0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_360,(PossibleContents *)&local_c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_c0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_360);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_340,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  pPVar2 = &(this->super_PossibleContentsTest).exactNonNullFuncSignatureType;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_a0,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_340,(PossibleContents *)&local_a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_a0);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_340);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_320,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar3);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_80,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar2);
  assertHaveIntersection((PossibleContents *)&local_320,(PossibleContents *)&local_80);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_80);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_320);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_300,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)pPVar1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&local_60,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).anyGlobal);
  assertLackIntersection((PossibleContents *)&local_300,(PossibleContents *)&local_60);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_60);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_300);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestIntersection) {
  // None has no contents, so nothing to intersect.
  assertLackIntersection(none, none);
  assertLackIntersection(none, i32Zero);
  assertLackIntersection(none, many);

  // Many intersects with anything (but none).
  assertHaveIntersection(many, many);
  assertHaveIntersection(many, i32Zero);

  // Different exact types cannot intersect.
  assertLackIntersection(exactI32, exactAnyref);
  assertLackIntersection(i32Zero, exactAnyref);

  // But nullable ones can - the null can be the intersection, if they are not
  // in separate hierarchies.
  assertHaveIntersection(exactFuncSignatureType, funcNull);

  assertLackIntersection(exactFuncSignatureType, exactAnyref);
  assertLackIntersection(anyNull, funcNull);

  // Identical types might.
  assertHaveIntersection(exactI32, exactI32);
  assertHaveIntersection(i32Zero, i32Zero);
  assertHaveIntersection(exactFuncSignatureType, exactFuncSignatureType);
  assertHaveIntersection(i32Zero, i32One); // TODO: this could be inferred false

  // Exact types only differing by nullability can intersect (not on the null,
  // but on something else).
  assertHaveIntersection(exactAnyref, exactNonNullAnyref);

  // Due to subtyping, an intersection might exist.
  assertHaveIntersection(funcGlobal, funcGlobal);
  assertHaveIntersection(funcGlobal, exactFuncSignatureType);
  assertHaveIntersection(nonNullFuncGlobal, exactFuncSignatureType);
  assertHaveIntersection(funcGlobal, exactNonNullFuncSignatureType);
  assertHaveIntersection(nonNullFuncGlobal, exactNonNullFuncSignatureType);

  // Separate hierarchies.
  assertLackIntersection(funcGlobal, anyGlobal);
}